

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeArrayPrototype
               (DynamicObject *arrayPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  RecyclableObject *prototype;
  code *pcVar1;
  bool bVar2;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar3;
  Type *builtInFuncs;
  JavascriptFunction *pJVar4;
  JavascriptFunction **ppJVar5;
  undefined4 *puVar6;
  ScriptConfiguration *pSVar7;
  RecyclableObject **ppRVar8;
  DynamicTypeHandler *typeHandler_00;
  DynamicType *type;
  Recycler *recycler;
  DynamicObject *value;
  Var pvVar9;
  DynamicObject *unscopablesList;
  DynamicType *dynamicType;
  JavascriptFunction *values;
  Type *builtinFuncs;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *arrayPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayPrototype,mode,0x1b,0);
  this = RecyclableObject::GetScriptContext(&arrayPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&arrayPrototype->super_RecyclableObject);
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).arrayConstructor);
  AddMember(this_00,arrayPrototype,0x67,*ppRVar3);
  builtInFuncs = GetBuiltinFunctions(this_00);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x51,(FunctionInfo *)Js::JavascriptArray::EntryInfo::At
                      ,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x30,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x127,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Push,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x29,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x65,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Concat,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x31,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0xcc,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Join,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x35,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x120,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Pop,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x2a,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x136,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Reverse,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x37,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x14e,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Shift,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x38,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x150,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Slice,2,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x39,pJVar4);
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x155,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Splice,2,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x3a,pJVar4);
  ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this_00->arrayPrototypeToStringFunction);
  if (*ppJVar5 == (JavascriptFunction *)0x0) {
    ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->arrayPrototypeToLocaleStringFunction);
    if (*ppJVar5 != (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x80e,
                                  "(library->arrayPrototypeToLocaleStringFunction == nullptr)",
                                  "library->arrayPrototypeToLocaleStringFunction == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pJVar4 = AddFunctionToLibraryObject
                       (this_00,arrayPrototype,0x172,
                        (FunctionInfo *)Js::JavascriptArray::EntryInfo::ToLocaleString,0,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
              (&this_00->arrayPrototypeToLocaleStringFunction,pJVar4);
    pJVar4 = AddFunctionToLibraryObject
                       (this_00,arrayPrototype,0x178,
                        (FunctionInfo *)Js::JavascriptArray::EntryInfo::ToString,0,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
              (&this_00->arrayPrototypeToStringFunction,pJVar4);
  }
  else {
    ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->arrayPrototypeToLocaleStringFunction);
    if (*ppJVar5 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x815,"(library->arrayPrototypeToLocaleStringFunction)",
                                  "library->arrayPrototypeToLocaleStringFunction");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->arrayPrototypeToLocaleStringFunction);
    AddMember(this_00,arrayPrototype,0x172,*ppJVar5);
    ppJVar5 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->arrayPrototypeToStringFunction);
    AddMember(this_00,arrayPrototype,0x178,*ppJVar5);
  }
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0x18a,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::Unshift,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x3b,pJVar4);
  bVar2 = ScriptContext::IsJsBuiltInEnabled(this);
  if (!bVar2) {
    pJVar4 = AddFunctionToLibraryObject
                       (this_00,arrayPrototype,0xb9,
                        (FunctionInfo *)Js::JavascriptArray::EntryInfo::IndexOf,1,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x32,pJVar4);
    pJVar4 = AddFunctionToLibraryObject
                       (this_00,arrayPrototype,0xb8,
                        (FunctionInfo *)Js::JavascriptArray::EntryInfo::Includes,1,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x33,pJVar4);
  }
  AddFunctionToLibraryObject
            (this_00,arrayPrototype,0x152,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Sort,1,
             '\x06');
  pJVar4 = AddFunctionToLibraryObject
                     (this_00,arrayPrototype,0xd0,
                      (FunctionInfo *)Js::JavascriptArray::EntryInfo::LastIndexOf,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(builtInFuncs + 0x36,pJVar4);
  AddFunctionToLibraryObject
            (this_00,arrayPrototype,0xd5,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Map,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,arrayPrototype,0x12d,
             (FunctionInfo *)Js::JavascriptArray::EntryInfo::ReduceRight,1,'\x06');
  pSVar7 = ScriptContext::GetConfig(this);
  bVar2 = ScriptConfiguration::IsES6StringExtensionsEnabled(pSVar7);
  if (bVar2) {
    AddFunctionToLibraryObject
              (this_00,arrayPrototype,0x8b,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Find,1,
               '\x06');
    AddFunctionToLibraryObject
              (this_00,arrayPrototype,0x8c,(FunctionInfo *)Js::JavascriptArray::EntryInfo::FindIndex
               ,1,'\x06');
  }
  pSVar7 = ScriptContext::GetConfig(this);
  bVar2 = ScriptConfiguration::IsESArrayFindFromLastEnabled(pSVar7);
  if (bVar2) {
    AddFunctionToLibraryObject
              (this_00,arrayPrototype,0x8d,(FunctionInfo *)Js::JavascriptArray::EntryInfo::FindLast,
               1,'\x06');
    AddFunctionToLibraryObject
              (this_00,arrayPrototype,0x8e,
               (FunctionInfo *)Js::JavascriptArray::EntryInfo::FindLastIndex,1,'\x06');
  }
  bVar2 = ScriptContext::IsJsBuiltInEnabled(this);
  if (bVar2) {
    EnsureBuiltInEngineIsReady(Array_prototype,this);
  }
  else {
    pJVar4 = EnsureArrayPrototypeEntriesFunction(this_00);
    AddMember(this_00,arrayPrototype,0x7a,pJVar4);
    pJVar4 = EnsureArrayPrototypeKeysFunction(this_00);
    AddMember(this_00,arrayPrototype,0xcf,pJVar4);
    pJVar4 = EnsureArrayPrototypeValuesFunction(this_00);
    AddMember(this_00,arrayPrototype,399,pJVar4);
    AddMember(this_00,arrayPrototype,0x14,pJVar4);
    AddFunctionToLibraryObject
              (this_00,arrayPrototype,0x89,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Filter,1,
               '\x06');
    pJVar4 = EnsureArrayPrototypeForEachFunction(this_00);
    AddMember(this_00,arrayPrototype,0x93,pJVar4);
    AddFunctionToLibraryObject
              (this_00,arrayPrototype,0x151,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Some,1,
               '\x06');
    AddFunctionToLibraryObject
              (this_00,arrayPrototype,300,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Reduce,1,
               '\x06');
    AddFunctionToLibraryObject
              (this_00,arrayPrototype,0x82,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Every,1,
               '\x06');
  }
  ppRVar8 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).nullValue);
  prototype = *ppRVar8;
  typeHandler_00 = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
  type = DynamicType::New(this,TypeIds_Object,prototype,(JavascriptMethod)0x0,typeHandler_00,false,
                          false);
  recycler = GetRecycler(this_00);
  value = DynamicObject::New(recycler,type);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0x51,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,99,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0x7a,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0x88,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0x8b,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0x8c,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0x86,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0x87,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0xb8,pvVar9,0,0);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,0xcf,pvVar9);
  pvVar9 = JavascriptBoolean::ToVar(1,this);
  (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(value,399,pvVar9,0,0);
  pSVar7 = ScriptContext::GetConfig(this);
  bVar2 = ScriptConfiguration::IsESArrayFindFromLastEnabled(pSVar7);
  if (bVar2) {
    pvVar9 = JavascriptBoolean::ToVar(1,this);
    (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x17])(value,0x8d,pvVar9,0,0);
    pvVar9 = JavascriptBoolean::ToVar(1,this);
    (*(value->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x17])(value,0x8e,pvVar9,0,0);
  }
  AddMember(this_00,arrayPrototype,0x1c,value,'\x02');
  AddFunctionToLibraryObject
            (this_00,arrayPrototype,0x88,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Fill,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,arrayPrototype,99,(FunctionInfo *)Js::JavascriptArray::EntryInfo::CopyWithin,2,
             '\x06');
  CheckRegisteredBuiltIns(builtInFuncs,this);
  DynamicObject::SetHasNoEnumerableProperties(arrayPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayPrototype(DynamicObject* arrayPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayPrototype, mode, 27);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterArray
        // so that the update is in sync with profiler

        ScriptContext* scriptContext = arrayPrototype->GetScriptContext();
        JavascriptLibrary* library = arrayPrototype->GetLibrary();

        library->AddMember(arrayPrototype, PropertyIds::constructor, library->arrayConstructor);

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        builtinFuncs[BuiltinFunction::JavascriptArray_At]                 = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::at,              &JavascriptArray::EntryInfo::At,                1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Push]               = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::push,            &JavascriptArray::EntryInfo::Push,              1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Concat]             = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::concat,          &JavascriptArray::EntryInfo::Concat,            1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Join]               = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::join,            &JavascriptArray::EntryInfo::Join,              1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Pop]                = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::pop,             &JavascriptArray::EntryInfo::Pop,               0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Reverse]            = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reverse,         &JavascriptArray::EntryInfo::Reverse,           0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Shift]              = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::shift,           &JavascriptArray::EntryInfo::Shift,             0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Slice]              = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::slice,           &JavascriptArray::EntryInfo::Slice,             2);
        builtinFuncs[BuiltinFunction::JavascriptArray_Splice]             = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::splice,          &JavascriptArray::EntryInfo::Splice,            2);

        // The toString and toLocaleString properties are shared between Array.prototype and %TypedArray%.prototype.
        // Whichever prototype is initialized first will create the functions, the other should just load the existing function objects.
        if (library->arrayPrototypeToStringFunction == nullptr)
        {
            Assert(library->arrayPrototypeToLocaleStringFunction == nullptr);

            library->arrayPrototypeToLocaleStringFunction = /* No inlining       Array_ToLocaleString */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::toLocaleString, &JavascriptArray::EntryInfo::ToLocaleString, 0);
            library->arrayPrototypeToStringFunction =       /* No inlining       Array_ToString       */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::toString, &JavascriptArray::EntryInfo::ToString, 0);
        }
        else
        {
            Assert(library->arrayPrototypeToLocaleStringFunction);

            library->AddMember(arrayPrototype, PropertyIds::toLocaleString, library->arrayPrototypeToLocaleStringFunction);
            library->AddMember(arrayPrototype, PropertyIds::toString, library->arrayPrototypeToStringFunction);
        }

        builtinFuncs[BuiltinFunction::JavascriptArray_Unshift]            = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::unshift,         &JavascriptArray::EntryInfo::Unshift,           1);

        if (!scriptContext->IsJsBuiltInEnabled())
        {
            builtinFuncs[BuiltinFunction::JavascriptArray_IndexOf] = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::indexOf, &JavascriptArray::EntryInfo::IndexOf, 1);
            builtinFuncs[BuiltinFunction::JavascriptArray_Includes] = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::includes, &JavascriptArray::EntryInfo::Includes, 1);
        }

        /* No inlining                Array_Sort               */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::sort, &JavascriptArray::EntryInfo::Sort, 1);

        builtinFuncs[BuiltinFunction::JavascriptArray_LastIndexOf]    = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::lastIndexOf,     &JavascriptArray::EntryInfo::LastIndexOf,       1);
        /* No inlining                Array_Map            */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::map,             &JavascriptArray::EntryInfo::Map,               1);
        /* No inlining                Array_ReduceRight    */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reduceRight,     &JavascriptArray::EntryInfo::ReduceRight,       1);

        if (scriptContext->GetConfig()->IsES6StringExtensionsEnabled()) // This is not a typo, Array.prototype.find and .findIndex are part of the ES6 Improved String APIs feature
        {
            /* No inlining            Array_Find           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::find,            &JavascriptArray::EntryInfo::Find,              1);
            /* No inlining            Array_FindIndex      */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findIndex,       &JavascriptArray::EntryInfo::FindIndex,         1);
        }
        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled())
        {
            /* No inlining            Array_FindLast           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findLast, &JavascriptArray::EntryInfo::FindLast, 1);
            /* No inlining            Array_FindLastIndex      */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findLastIndex, &JavascriptArray::EntryInfo::FindLastIndex, 1);
        }

#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
        }
        else
#endif
        {
            /* No inlining                Array_Entries        */
            library->AddMember(arrayPrototype, PropertyIds::entries, library->EnsureArrayPrototypeEntriesFunction());

            /* No inlining                Array_Keys           */
            library->AddMember(arrayPrototype, PropertyIds::keys, library->EnsureArrayPrototypeKeysFunction());

            JavascriptFunction *values = library->EnsureArrayPrototypeValuesFunction();
            /* No inlining                Array_Values         */ library->AddMember(arrayPrototype, PropertyIds::values, values);
            /* No inlining                Array_SymbolIterator */ library->AddMember(arrayPrototype, PropertyIds::_symbolIterator, values);

            /* No inlining                Array_Filter         */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::filter, &JavascriptArray::EntryInfo::Filter, 1);
            /* No inlining                Array_ForEach        */ library->AddMember(arrayPrototype, PropertyIds::forEach, library->EnsureArrayPrototypeForEachFunction());
            /* No inlining                Array_Some           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::some, &JavascriptArray::EntryInfo::Some, 1);
            /* No inlining                Array_Reduce         */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reduce, &JavascriptArray::EntryInfo::Reduce, 1);
            /* No inlining                Array_Every          */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::every, &JavascriptArray::EntryInfo::Every, 1);
        }

        DynamicType* dynamicType = DynamicType::New(scriptContext, TypeIds_Object, library->nullValue, nullptr, NullTypeHandler<false>::GetDefaultInstance(), false);
        DynamicObject* unscopablesList = DynamicObject::New(library->GetRecycler(), dynamicType);
        unscopablesList->SetProperty(PropertyIds::at,               JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::copyWithin,       JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::entries,          JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::fill,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::find,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::findIndex,        JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::flat,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::flatMap,          JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::includes,         JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::keys,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::values,           JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);

        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled())
        {
            unscopablesList->SetProperty(PropertyIds::findLast, JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
            unscopablesList->SetProperty(PropertyIds::findLastIndex, JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        }

        library->AddMember(arrayPrototype, PropertyIds::_symbolUnscopables, unscopablesList, PropertyConfigurable);

        /* No inlining            Array_Fill           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::fill, &JavascriptArray::EntryInfo::Fill, 1);
        /* No inlining            Array_CopyWithin     */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::copyWithin, &JavascriptArray::EntryInfo::CopyWithin, 2);
        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        arrayPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }